

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O1

bool test_DiceRoller_getPercentages(void)

{
  int *piVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  DiceRoller *this;
  undefined8 uVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  bool bVar7;
  int iVar8;
  void *pvVar9;
  bool bVar10;
  vector<double,_std::allocator<double>_> *__return_storage_ptr__;
  vector<double,_std::allocator<double>_> local_50;
  double local_38;
  
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = 0;
  plVar3[1] = 0;
  plVar3[2] = 0;
  puVar4 = (undefined8 *)operator_new(0x18);
  *plVar3 = (long)puVar4;
  plVar3[1] = (long)puVar4;
  plVar3[2] = (long)(puVar4 + 3);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  plVar3[1] = (long)(puVar4 + 3);
  this = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this);
  iVar8 = 100;
  __return_storage_ptr__ = &local_50;
  do {
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,this,1);
    if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      goto LAB_00101955;
    }
    iVar2 = *(int *)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    piVar1 = (int *)(*plVar3 + -4 + (long)iVar2 * 4);
    *piVar1 = *piVar1 + 1;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  pvVar9 = (void *)*plVar3;
  pvVar6 = (vector<double,_std::allocator<double>_> *)(plVar3[1] - (long)pvVar9 >> 2);
  if ((int)pvVar6 < 1) {
    bVar10 = true;
  }
  else {
    __return_storage_ptr__ = (vector<double,_std::allocator<double>_> *)0x0;
    bVar7 = true;
    do {
      if (pvVar6 <= __return_storage_ptr__) {
LAB_00101955:
        uVar5 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,__return_storage_ptr__);
        operator_delete(this,0x10);
        _Unwind_Resume(uVar5);
      }
      if (bVar7) {
        local_38 = (double)*(int *)((long)pvVar9 + (long)__return_storage_ptr__ * 4) / 100.0;
        DiceRoller::getPercentages(&local_50,this);
        bVar10 = local_38 ==
                 local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)__return_storage_ptr__];
      }
      else {
        bVar10 = false;
      }
      if ((bVar7 != false) &&
         (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      __return_storage_ptr__ =
           (vector<double,_std::allocator<double>_> *)
           ((long)&(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start + 1);
      pvVar9 = (void *)*plVar3;
      pvVar6 = (vector<double,_std::allocator<double>_> *)(plVar3[1] - (long)pvVar9 >> 2);
      bVar7 = bVar10;
    } while ((long)__return_storage_ptr__ < (long)(int)((ulong)(plVar3[1] - (long)pvVar9) >> 2));
  }
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,plVar3[2] - (long)pvVar9);
  }
  operator_delete(plVar3,0x18);
  DiceRoller::~DiceRoller(this);
  operator_delete(this,0x10);
  return bVar10;
}

Assistant:

bool test_DiceRoller_getPercentages() {
    bool success = true;
    int timesRolled = 0;
    auto* history = new std::vector<int>(6);
    auto* roller = new DiceRoller();
    for (int x = 0; x < 100; x++) {
        int roll = roller->roll(1).at(0);
        timesRolled++;
        (*history)[roll - 1]++;
    }

    for (int x = 0; x < (int) history->size(); x++) {
        double percent = (double) history->at(x) / (double) timesRolled;
        success = success && percent == roller->getPercentages()[x];
    }

    delete (history);
    delete (roller);

    return success;
}